

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

int __thiscall
gmlc::utilities::stringOps::trailingStringInt
          (stringOps *this,string_view input,string *output,int defNum)

{
  stringOps *psVar1;
  char cVar2;
  void *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  stringOps *__len2;
  bool bVar4;
  int num;
  int local_3c;
  char *local_38;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input._M_str;
  __s = (char *)input._M_len;
  local_3c = (int)output;
  if ((this == (stringOps *)0x0) ||
     (cVar2 = (__s + -1)[(long)this], (int)cVar2 - 0x3aU < 0xfffffff6)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this_00,0,this_00->_M_string_length,__s,(size_type)this);
  }
  else {
    local_38 = __s + (long)this;
    __len2 = this + -1;
    do {
      pvVar3 = memchr("0123456789",(int)__s[(long)__len2],10);
      if (pvVar3 == (void *)0x0) goto LAB_003a0494;
      bVar4 = __len2 != (stringOps *)0x0;
      __len2 = __len2 + -1;
    } while (bVar4);
    __len2 = (stringOps *)0xffffffffffffffff;
LAB_003a0494:
    if (__len2 == (stringOps *)0xffffffffffffffff) {
      if (this < (stringOps *)0xb) {
        this_00->_M_string_length = 0;
        *(this_00->_M_dataplus)._M_p = '\0';
        std::from_chars<int>(__s,local_38,&local_3c,10);
        return local_3c;
      }
      __len2 = this + -10;
    }
    if (__len2 == this + -2) {
      local_3c = cVar2 + -0x30;
    }
    else if ((this < (stringOps *)0xb) || (this + -10 <= __len2)) {
      psVar1 = __len2 + 1;
      if (this < psVar1) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar1,this);
      }
      std::from_chars<int>((char *)(psVar1 + (long)__s),local_38,&local_3c,10);
    }
    else {
      std::from_chars<int>(__s + (long)this + -9,local_38,&local_3c,10);
      __len2 = this + -10;
    }
    if ((__s[(long)__len2] != '#') && (__s[(long)__len2] != '_')) {
      __len2 = __len2 + 1;
    }
    if (this < __len2) {
      __len2 = this;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this_00,0,this_00->_M_string_length,__s,(size_type)__len2);
  }
  return local_3c;
}

Assistant:

int trailingStringInt(
        std::string_view input,
        std::string& output,
        int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            output = input;
            return defNum;
        }
        int num = defNum;
        auto pos1 = input.find_last_not_of(digits);
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                output.clear();
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            num = input.back() - '0';
        } else if (length <= 10 || pos1 >= length - 10) {
            auto sub = input.substr(pos1 + 1);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
        } else {
            auto sub = input.substr(length - 9);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            pos1 = length - 10;
        }

        if (input[pos1] == '_' || input[pos1] == '#') {
            output = input.substr(0, pos1);
        } else {
            output = input.substr(0, pos1 + 1);
        }

        return num;
    }